

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O2

_Bool player_set_timed(player *p,wchar_t idx,wchar_t v,_Bool notify,_Bool can_disturb)

{
  wchar_t wVar1;
  int flag;
  player_upkeep *ppVar2;
  bool bVar3;
  _Bool _Var4;
  wchar_t wVar5;
  object *obj;
  undefined7 extraout_var;
  object *obj_00;
  undefined7 extraout_var_00;
  int16_t *piVar6;
  undefined7 in_register_00000009;
  char *string;
  undefined7 in_register_00000081;
  _Bool *ident_00;
  timed_grade *ptVar7;
  effect *effect;
  timed_grade *ptVar8;
  source sVar9;
  source origin;
  _Bool ident_1;
  _Bool ident;
  undefined4 local_64;
  undefined4 local_60;
  bitflag collect_f [5];
  bitflag local_35 [5];
  
  if (idx < L'\0') {
    __assert_fail("idx >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0x316,"_Bool player_set_timed(struct player *, int, int, _Bool, _Bool)");
  }
  local_60 = (undefined4)CONCAT71(in_register_00000081,can_disturb);
  local_64 = (undefined4)CONCAT71(in_register_00000009,notify);
  if (0x34 < (uint)idx) {
    __assert_fail("idx < TMD_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0x317,"_Bool player_set_timed(struct player *, int, int, _Bool, _Bool)");
  }
  ptVar8 = timed_effects[(uint)idx].grade;
  obj = equipped_item_by_slot_name(p,"weapon");
  if (v < timed_effects[(uint)idx].lower_bound) {
    v = timed_effects[(uint)idx].lower_bound;
  }
  wVar5 = (wchar_t)p->timed[(uint)idx];
  ptVar7 = ptVar8;
  if (v == wVar5) {
    return false;
  }
  do {
    if (v <= ptVar7->max) break;
    ptVar7 = ptVar7->next;
  } while (ptVar7->next != (timed_grade *)0x0);
  do {
    if (wVar5 <= ptVar8->max) break;
    ptVar8 = ptVar8->next;
  } while (ptVar8->next != (timed_grade *)0x0);
  wVar1 = ptVar7->max;
  if ((wVar1 < v) && (v = wVar1, wVar1 == wVar5)) {
    return false;
  }
  wVar5 = timed_effects[(uint)idx].temp_resist;
  if (((long)wVar5 != -1) && (p->obj_k->el_info[wVar5].res_level != 0)) {
    _Var4 = player_is_immune(p,wVar5);
    local_64 = (undefined4)CONCAT71(extraout_var,~_Var4 & (byte)local_64);
  }
  if (((timed_effects[(uint)idx].oflag_syn == true) && (timed_effects[(uint)idx].oflag_dup != 0)) &&
     (_Var4 = flag_has_dbg(p->obj_k->flags,5,timed_effects[(uint)idx].oflag_dup,"p->obj_k->flags",
                           "timed_effects[idx].oflag_dup"), _Var4)) {
    flag = timed_effects[(uint)idx].oflag_dup;
    player_flags(p,collect_f);
    for (wVar5 = L'\0'; (uint)wVar5 < (uint)(p->body).count; wVar5 = wVar5 + L'\x01') {
      obj_00 = slot_object(p,wVar5);
      if (obj_00 != (object *)0x0) {
        object_flags(obj_00,local_35);
        flag_union(collect_f,local_35,5);
      }
    }
    _Var4 = flag_has_dbg(collect_f,5,flag,"collect_f","flag");
    local_64 = (undefined4)CONCAT71(extraout_var_00,!_Var4 & (byte)local_64);
  }
  if (ptVar8->grade < ptVar7->grade) {
    print_custom_message(obj,ptVar7->up_msg,timed_effects[(uint)idx].msgt,p);
    bVar3 = true;
LAB_0019f72e:
    if (v < L'\x01') {
      if (v == L'\0') goto LAB_0019f794;
      goto LAB_0019f7b0;
    }
    piVar6 = p->timed;
    if (piVar6[(uint)idx] == 0) {
      effect = timed_effects[(uint)idx].on_begin_effect;
      if (effect == (effect *)0x0) goto LAB_0019f7b0;
      ident = false;
      if ((char)local_60 == '\0') {
        sVar9 = source_player();
      }
      else {
        sVar9 = source_none();
      }
      ident_00 = &ident;
      goto LAB_0019f7f4;
    }
  }
  else {
    if ((ptVar7->grade < ptVar8->grade) && (string = ptVar7->down_msg, string != (char *)0x0)) {
LAB_0019f6d5:
      print_custom_message(obj,string,timed_effects[(uint)idx].msgt,p);
      bVar3 = true;
      goto LAB_0019f72e;
    }
    if ((byte)local_64 == '\0') {
      bVar3 = false;
      goto LAB_0019f72e;
    }
    if (v != L'\0') {
      if ((v < p->timed[(uint)idx]) &&
         (string = timed_effects[(uint)idx].on_decrease, string != (char *)0x0)) goto LAB_0019f6d5;
      bVar3 = true;
      if ((p->timed[(uint)idx] < v) && (timed_effects[(uint)idx].on_increase != (char *)0x0)) {
        print_custom_message
                  (obj,timed_effects[(uint)idx].on_increase,timed_effects[(uint)idx].msgt,p);
      }
      goto LAB_0019f72e;
    }
    print_custom_message(obj,timed_effects[(uint)idx].on_end,L'5',p);
    bVar3 = true;
LAB_0019f794:
    effect = timed_effects[(uint)idx].on_end_effect;
    if (effect != (effect *)0x0) {
      ident_1 = false;
      if ((char)local_60 == '\0') {
        sVar9 = source_player();
      }
      else {
        sVar9 = source_none();
      }
      ident_00 = &ident_1;
LAB_0019f7f4:
      origin.which = sVar9.which;
      origin._4_4_ = 0;
      origin.what = sVar9.what;
      effect_do(effect,origin,(object *)0x0,ident_00,true,L'\0',L'\0',L'\0',(command *)0x0);
      p->timed[(uint)idx] = (int16_t)v;
      if (!bVar3) {
        return false;
      }
      goto LAB_0019f812;
    }
LAB_0019f7b0:
    piVar6 = p->timed;
  }
  piVar6[(uint)idx] = (int16_t)v;
  if (!bVar3) {
    return false;
  }
LAB_0019f812:
  if ((char)local_60 != '\0') {
    disturb(p);
  }
  ppVar2 = p->upkeep;
  ppVar2->update = ppVar2->update | timed_effects[(uint)idx].flag_update;
  ppVar2->redraw = timed_effects[(uint)idx].flag_redraw | ppVar2->redraw | 0x2000;
  handle_stuff(p);
  return true;
}

Assistant:

bool player_set_timed(struct player *p, int idx, int v, bool notify,
		bool can_disturb)
{
	assert(idx >= 0);
	assert(idx < TMD_MAX);

	struct timed_effect_data *effect = &timed_effects[idx];
	struct timed_grade *new_grade = effect->grade;
	struct timed_grade *current_grade = effect->grade;
	struct object *weapon = equipped_item_by_slot_name(p, "weapon");

	/* Lower bound */
	v = MAX(v, effect->lower_bound);

	/* No change */
	if (p->timed[idx] == v) {
		return false;
	}

	/* Find the grade we will be going to, and the current one */
	while (v > new_grade->max) {
		new_grade = new_grade->next;
		if (!new_grade->next) break;
	}
	while (p->timed[idx] > current_grade->max) {
		current_grade = current_grade->next;
		if (!current_grade->next) break;
	}

	/* Upper bound */
	if (v > new_grade->max) {
		if (p->timed[idx] == new_grade->max) {
			/*
			 * No change:  tried to exceed the maximum possible and
			 * already there
			 */
			return false;
		}
		v = new_grade->max;
	}

	/* Don't mention effects which already match the known player state. */
	if (timed_effects[idx].temp_resist != -1 &&
			p->obj_k->el_info[timed_effects[idx].temp_resist].res_level &&
			player_is_immune(p, timed_effects[idx].temp_resist)) {
		notify = false;
	}
	if (timed_effects[idx].oflag_syn &&
			timed_effects[idx].oflag_dup != OF_NONE &&
			of_has(p->obj_k->flags, timed_effects[idx].oflag_dup) &&
			player_of_has_not_timed(p, timed_effects[idx].oflag_dup)) {
		notify = false;
	}

	/* Always mention going up a grade, otherwise on request */
	if (new_grade->grade > current_grade->grade) {
		print_custom_message(weapon, new_grade->up_msg,
			effect->msgt, p);
		notify = true;
	} else if ((new_grade->grade < current_grade->grade) &&
			(new_grade->down_msg)) {
		print_custom_message(weapon, new_grade->down_msg,
			effect->msgt, p);
		notify = true;
	} else if (notify) {
		if (v == 0) {
			/* Finishing */
			print_custom_message(weapon, effect->on_end,
				MSG_RECOVER, p);
		} else if (p->timed[idx] > v && effect->on_decrease) {
			/* Decrementing */
			print_custom_message(weapon, effect->on_decrease,
				effect->msgt, p);
		} else if (v > p->timed[idx] && effect->on_increase) {
			/* Incrementing */
			print_custom_message(weapon, effect->on_increase,
				effect->msgt, p);
		}
	}

	/*
	 * Dispatch effects for transitions.  Use source_player() as the
	 * origin if can_disturb is not true; otherwise, use source_none().
	 * That way any TIMED_INC or TIMED_INC_NO_RES effects in the effect
	 * chains will honor can_disturb.
	 */
	if (v > 0 && !p->timed[idx]) {
		/* The effect starts. */
		if (effect->on_begin_effect) {
			bool ident = false;

			(void) effect_do(effect->on_begin_effect,
				can_disturb ? source_none() : source_player(),
				NULL, &ident, true, 0, 0, 0, NULL);
		}
	} else if (v == 0) {
		/* The effect lapses. */
		if (effect->on_end_effect) {
			bool ident = false;

			(void) effect_do(effect->on_end_effect,
				can_disturb ? source_none() : source_player(),
				NULL, &ident, true, 0, 0, 0, NULL);
		}
	}

	/* Use the value */
	p->timed[idx] = v;

	if (notify) {
		/* Disturb */
		if (can_disturb) {
			disturb(p);
		}

		/* Update the visuals, as appropriate. */
		p->upkeep->update |= effect->flag_update;
		p->upkeep->redraw |= (PR_STATUS | effect->flag_redraw);

		/* Handle stuff */
		handle_stuff(p);
	}

	return notify;
}